

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  long lVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  string *psVar6;
  int64 iVar7;
  ulong uVar8;
  LogMessage *pLVar9;
  FieldDescriptor *local_50;
  code *local_48 [7];
  
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_48[0] = FieldDescriptor::TypeOnceInit;
    local_50 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),local_48,&local_50);
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
  case 2:
  case 10:
  case 0xb:
  case 0xc:
  case 0xe:
    LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x47c);
    pLVar9 = LogMessage::operator<<((LogMessage *)local_48,"Unsupported");
    LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
    goto LAB_002b624d;
  case 3:
    uVar8 = MapKey::GetInt64Value(value);
    goto LAB_002b62ee;
  case 4:
    uVar8 = MapKey::GetUInt64Value(value);
    goto LAB_002b62ee;
  case 5:
    uVar3 = MapKey::GetInt32Value(value);
    if ((int)uVar3 < 0) {
      return 10;
    }
    goto LAB_002b62d3;
  case 6:
  case 0x10:
    sVar5 = 8;
    break;
  case 7:
  case 0xf:
    sVar5 = 4;
    break;
  case 8:
    sVar5 = 1;
    break;
  case 9:
    psVar6 = MapKey::GetStringValue_abi_cxx11_(value);
    uVar3 = (uint)psVar6->_M_string_length | 1;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = (ulong)(iVar4 * 9 + 0x49U >> 6) + psVar6->_M_string_length;
    break;
  case 0xd:
    uVar3 = MapKey::GetUInt32Value(value);
LAB_002b62d3:
    iVar4 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_002b634d;
  case 0x11:
    iVar2 = MapKey::GetInt32Value(value);
    uVar3 = iVar2 >> 0x1f ^ iVar2 * 2 | 1;
    iVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_002b634d;
  case 0x12:
    iVar7 = MapKey::GetInt64Value(value);
    uVar8 = iVar7 >> 0x3f ^ iVar7 * 2;
LAB_002b62ee:
    lVar1 = 0x3f;
    if ((uVar8 | 1) != 0) {
      for (; (uVar8 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = (int)lVar1;
LAB_002b634d:
    sVar5 = (size_t)(iVar4 * 9 + 0x49U >> 6);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x497);
    pLVar9 = LogMessage::operator<<((LogMessage *)local_48,"Cannot get here");
    LogFinisher::operator=((LogFinisher *)&local_50,pLVar9);
LAB_002b624d:
    LogMessage::~LogMessage((LogMessage *)local_48);
    sVar5 = 0;
  }
  return sVar5;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}